

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

void gflags::anon_unknown_2::FinalizeCompletionOutput
               (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                *matching_flags,CompletionOptions *options,NotableFlags *notable_flags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *completions)

{
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  *group_00;
  char *pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  pointer pDVar6;
  size_type __n;
  size_type sVar7;
  allocator<char> local_1e9;
  value_type local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  __normal_iterator<gflags::(anonymous_namespace)::DisplayInfoGroup_*,_std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>_>
  local_150;
  __normal_iterator<gflags::(anonymous_namespace)::DisplayInfoGroup_*,_std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>_>
  local_148;
  __normal_iterator<const_gflags::(anonymous_namespace)::DisplayInfoGroup_*,_std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>_>
  local_140;
  const_iterator it;
  size_type sStack_130;
  int indent;
  size_t completions_output;
  undefined1 auStack_120 [4];
  int remaining_lines;
  DisplayInfoGroup group_5;
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  obscure_flags;
  DisplayInfoGroup group_4;
  DisplayInfoGroup group_3;
  DisplayInfoGroup group_2;
  DisplayInfoGroup group_1;
  undefined1 local_68 [8];
  DisplayInfoGroup group;
  undefined1 local_48 [7];
  bool perfect_match_found;
  vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
  output_groups;
  int lines_so_far;
  int max_desired_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *completions_local;
  NotableFlags *notable_flags_local;
  CompletionOptions *options_local;
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  *matching_flags_local;
  
  output_groups.
  super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x62;
  if ((options->return_all_matching_flags & 1U) != 0) {
    output_groups.
    super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 999999;
  }
  output_groups.
  super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
  ::vector((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
            *)local_48);
  group.group._7_1_ = 0;
  bVar3 = std::
          set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          ::empty(&notable_flags->perfect_match_flag);
  if (!bVar3) {
    group.group._7_1_ = 1;
    local_68 = (undefined1  [8])0x1573fe;
    group.header = "==========";
    group.footer = (char *)notable_flags;
    iVar4 = DisplayInfoGroup::SizeInLines((DisplayInfoGroup *)local_68);
    output_groups.
    super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)output_groups.
              super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + iVar4;
    std::
    vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ::push_back((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                 *)local_48,(value_type *)local_68);
  }
  if (((int)output_groups.
            super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage <
       output_groups.
       super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) &&
     (bVar3 = std::
              set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
              ::empty(&notable_flags->module_flags), !bVar3)) {
    group_2.group =
         (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          *)anon_var_dwarf_a69a3;
    iVar4 = DisplayInfoGroup::SizeInLines((DisplayInfoGroup *)&group_2.group);
    output_groups.
    super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)output_groups.
              super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + iVar4;
    std::
    vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ::push_back((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                 *)local_48,(value_type *)&group_2.group);
  }
  if (((int)output_groups.
            super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage <
       output_groups.
       super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) &&
     (bVar3 = std::
              set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
              ::empty(&notable_flags->package_flags), !bVar3)) {
    group_3.group =
         (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          *)anon_var_dwarf_a69c7;
    group_2.header = "============================";
    group_2.footer = (char *)&notable_flags->package_flags;
    iVar4 = DisplayInfoGroup::SizeInLines((DisplayInfoGroup *)&group_3.group);
    output_groups.
    super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)output_groups.
              super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + iVar4;
    std::
    vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ::push_back((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                 *)local_48,(value_type *)&group_3.group);
  }
  if (((int)output_groups.
            super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage <
       output_groups.
       super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) &&
     (bVar3 = std::
              set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
              ::empty(&notable_flags->most_common_flags), !bVar3)) {
    group_4.group =
         (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          *)anon_var_dwarf_a69eb;
    group_3.header = "=========================";
    group_3.footer = (char *)&notable_flags->most_common_flags;
    iVar4 = DisplayInfoGroup::SizeInLines((DisplayInfoGroup *)&group_4.group);
    output_groups.
    super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)output_groups.
              super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + iVar4;
    std::
    vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ::push_back((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                 *)local_48,(value_type *)&group_4.group);
  }
  if (((int)output_groups.
            super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage <
       output_groups.
       super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) &&
     (bVar3 = std::
              set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
              ::empty(&notable_flags->subpackage_flags), !bVar3)) {
    obscure_flags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)anon_var_dwarf_a6a0f;
    group_4.header = "================================";
    group_4.footer = (char *)&notable_flags->subpackage_flags;
    iVar4 = DisplayInfoGroup::SizeInLines
                      ((DisplayInfoGroup *)
                       &obscure_flags._M_t._M_impl.super__Rb_tree_header._M_node_count);
    output_groups.
    super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)output_groups.
              super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + iVar4;
    std::
    vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
    ::push_back((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                 *)local_48,
                (value_type *)&obscure_flags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::set((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
         *)&group_5.group);
  if ((int)output_groups.
           super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage <
      output_groups.
      super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
    RetrieveUnusedFlags(matching_flags,notable_flags,
                        (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                         *)&group_5.group);
    bVar3 = std::
            set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
            ::empty((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                     *)&group_5.group);
    if (!bVar3) {
      _auStack_120 = "-* Other flags *-";
      group_5.header = "";
      group_5.footer = (char *)&group_5.group;
      iVar4 = DisplayInfoGroup::SizeInLines((DisplayInfoGroup *)auStack_120);
      output_groups.
      super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)output_groups.
                super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + iVar4;
      std::
      vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
      ::push_back((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                   *)local_48,(value_type *)auStack_120);
    }
  }
  completions_output._4_4_ =
       output_groups.
       super__Vector_base<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  sStack_130 = 0;
  sVar5 = std::
          vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
          ::size((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                  *)local_48);
  it._M_current._4_4_ = (int)sVar5 + -1;
  local_148._M_current =
       (DisplayInfoGroup *)
       std::
       vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
       ::begin((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                *)local_48);
  __gnu_cxx::
  __normal_iterator<gflags::(anonymous_namespace)::DisplayInfoGroup_const*,std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>>>
  ::__normal_iterator<gflags::(anonymous_namespace)::DisplayInfoGroup*>
            ((__normal_iterator<gflags::(anonymous_namespace)::DisplayInfoGroup_const*,std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>>>
              *)&local_140,&local_148);
  while( true ) {
    local_150._M_current =
         (DisplayInfoGroup *)
         std::
         vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
         ::end((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
                *)local_48);
    bVar3 = __gnu_cxx::operator!=(&local_140,&local_150);
    sVar2 = sStack_130;
    if (!bVar3) break;
    pDVar6 = __gnu_cxx::
             __normal_iterator<const_gflags::(anonymous_namespace)::DisplayInfoGroup_*,_std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>_>
             ::operator->(&local_140);
    group_00 = pDVar6->group;
    __n = (size_type)it._M_current._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,__n,' ',&local_171);
    pDVar6 = __gnu_cxx::
             __normal_iterator<const_gflags::(anonymous_namespace)::DisplayInfoGroup_*,_std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>_>
             ::operator->(&local_140);
    pcVar1 = pDVar6->header;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,pcVar1,&local_199);
    pDVar6 = __gnu_cxx::
             __normal_iterator<const_gflags::(anonymous_namespace)::DisplayInfoGroup_*,_std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>_>
             ::operator->(&local_140);
    pcVar1 = pDVar6->footer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar1,&local_1c1);
    OutputSingleGroupWithLimit
              (group_00,&local_170,&local_198,&local_1c0,(bool)(group.group._7_1_ & 1),
               (int *)((long)&completions_output + 4),&stack0xfffffffffffffed0,completions);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    group.group._7_1_ = 0;
    __gnu_cxx::
    __normal_iterator<const_gflags::(anonymous_namespace)::DisplayInfoGroup_*,_std::vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>_>
    ::operator++(&local_140);
    it._M_current._4_4_ = it._M_current._4_4_ + -1;
  }
  sVar7 = std::
          set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          ::size(matching_flags);
  if (sVar2 == sVar7) {
    options->force_no_update = true;
  }
  else {
    options->force_no_update = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"~ (Remaining flags hidden) ~",&local_1e9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(completions,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
  }
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::~set((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          *)&group_5.group);
  std::
  vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
  ::~vector((vector<gflags::(anonymous_namespace)::DisplayInfoGroup,_std::allocator<gflags::(anonymous_namespace)::DisplayInfoGroup>_>
             *)local_48);
  return;
}

Assistant:

static void FinalizeCompletionOutput(
    const set<const CommandLineFlagInfo *> &matching_flags,
    CompletionOptions *options,
    NotableFlags *notable_flags,
    vector<string> *completions) {

  // We want to output lines in groups.  Each group needs to be indented
  // the same to keep its lines together.  Unless otherwise required,
  // only 99 lines should be output to prevent bash from harassing the
  // user.

  // First, figure out which output groups we'll actually use.  For each
  // nonempty group, there will be ~3 lines of header & footer, plus all
  // output lines themselves.
  int max_desired_lines =  // "999999 flags should be enough for anyone.  -dave"
    (options->return_all_matching_flags ? 999999 : 98);
  int lines_so_far = 0;

  vector<DisplayInfoGroup> output_groups;
  bool perfect_match_found = false;
  if (!notable_flags->perfect_match_flag.empty()) {
    perfect_match_found = true;
    DisplayInfoGroup group =
        { "",
          "==========",
          &notable_flags->perfect_match_flag };
    lines_so_far += group.SizeInLines();
    output_groups.push_back(group);
  }
  if (lines_so_far < max_desired_lines &&
      !notable_flags->module_flags.empty()) {
    DisplayInfoGroup group = {
        "-* Matching module flags *-",
        "===========================",
        &notable_flags->module_flags };
    lines_so_far += group.SizeInLines();
    output_groups.push_back(group);
  }
  if (lines_so_far < max_desired_lines &&
      !notable_flags->package_flags.empty()) {
    DisplayInfoGroup group = {
        "-* Matching package flags *-",
        "============================",
        &notable_flags->package_flags };
    lines_so_far += group.SizeInLines();
    output_groups.push_back(group);
  }
  if (lines_so_far < max_desired_lines &&
      !notable_flags->most_common_flags.empty()) {
    DisplayInfoGroup group = {
        "-* Commonly used flags *-",
        "=========================",
        &notable_flags->most_common_flags };
    lines_so_far += group.SizeInLines();
    output_groups.push_back(group);
  }
  if (lines_so_far < max_desired_lines &&
      !notable_flags->subpackage_flags.empty()) {
    DisplayInfoGroup group = {
        "-* Matching sub-package flags *-",
        "================================",
        &notable_flags->subpackage_flags };
    lines_so_far += group.SizeInLines();
    output_groups.push_back(group);
  }

  set<const CommandLineFlagInfo *> obscure_flags;  // flags not notable
  if (lines_so_far < max_desired_lines) {
    RetrieveUnusedFlags(matching_flags, *notable_flags, &obscure_flags);
    if (!obscure_flags.empty()) {
      DisplayInfoGroup group = {
          "-* Other flags *-",
          "",
          &obscure_flags };
      lines_so_far += group.SizeInLines();
      output_groups.push_back(group);
    }
  }

  // Second, go through each of the chosen output groups and output
  // as many of those flags as we can, while remaining below our limit
  int remaining_lines = max_desired_lines;
  size_t completions_output = 0;
  int indent = static_cast<int>(output_groups.size()) - 1;
  for (vector<DisplayInfoGroup>::const_iterator it =
        output_groups.begin();
      it != output_groups.end();
      ++it, --indent) {
    OutputSingleGroupWithLimit(
        *it->group,  // group
        string(indent, ' '),  // line indentation
        string(it->header),  // header
        string(it->footer),  // footer
        perfect_match_found,  // long format
        &remaining_lines,  // line limit - reduces this by number printed
        &completions_output,  // completions (not lines) added
        completions);  // produced completions
    perfect_match_found = false;
  }

  if (completions_output != matching_flags.size()) {
    options->force_no_update = false;
    completions->push_back("~ (Remaining flags hidden) ~");
  } else {
    options->force_no_update = true;
  }
}